

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O2

bilingual_str *
operator+(bilingual_str *__return_storage_ptr__,bilingual_str lhs,bilingual_str *rhs)

{
  long lVar1;
  bilingual_str *in_RDX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bilingual_str::operator+=(rhs,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    bilingual_str::bilingual_str(__return_storage_ptr__,rhs);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline bilingual_str operator+(bilingual_str lhs, const bilingual_str& rhs)
{
    lhs += rhs;
    return lhs;
}